

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O2

bool __thiscall fast_float::bigint::shl(bigint *this,size_t n)

{
  bool bVar1;
  
  if ((n & 0x3f) == 0) {
LAB_001421aa:
    if (0x3f < n) {
      bVar1 = shl_limbs(this,n >> 6);
      if (!bVar1) goto LAB_001421c7;
    }
    bVar1 = true;
  }
  else {
    bVar1 = shl_bits(this,n & 0x3f);
    if (bVar1) goto LAB_001421aa;
LAB_001421c7:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

FASTFLOAT_CONSTEXPR20 bool shl(size_t n) noexcept {
    size_t rem = n % limb_bits;
    size_t div = n / limb_bits;
    if (rem != 0) {
      FASTFLOAT_TRY(shl_bits(rem));
    }
    if (div != 0) {
      FASTFLOAT_TRY(shl_limbs(div));
    }
    return true;
  }